

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int ** Amap_LibLookupTableAlloc(Vec_Ptr_t *vVec,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int **ppiVar5;
  int local_44;
  int Value;
  int nEntries;
  int nSize;
  int nTotal;
  int k;
  int i;
  int *pBuffer;
  int **pRes;
  Vec_Int_t *vOne;
  int fVerbose_local;
  Vec_Ptr_t *vVec_local;
  
  iVar1 = Vec_PtrSize(vVec);
  local_44 = iVar1;
  for (nTotal = 0; iVar2 = Vec_PtrSize(vVec), nTotal < iVar2; nTotal = nTotal + 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vVec,nTotal);
    iVar2 = Vec_IntSize(pVVar4);
    local_44 = iVar2 + local_44;
  }
  ppiVar5 = (int **)malloc(((long)iVar1 * 8 + (long)local_44) * 4);
  *ppiVar5 = (int *)(ppiVar5 + (long)iVar1 * 4);
  nEntries = 0;
  for (nTotal = 0; iVar1 = Vec_PtrSize(vVec), nTotal < iVar1; nTotal = nTotal + 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vVec,nTotal);
    ppiVar5[nTotal] = *ppiVar5 + nEntries;
    iVar1 = Vec_IntSize(pVVar4);
    nEntries = iVar1 + 1 + nEntries;
    if (fVerbose != 0) {
      printf("%d : ",(ulong)(uint)nTotal);
    }
    for (nSize = 0; iVar1 = Vec_IntSize(pVVar4), nSize < iVar1; nSize = nSize + 1) {
      uVar3 = Vec_IntEntry(pVVar4,nSize);
      ppiVar5[nTotal][nSize] = uVar3;
      if (fVerbose != 0) {
        printf("%d(%d) ",(ulong)(uVar3 & 0xffff),(ulong)(uint)((int)uVar3 >> 0x10));
      }
    }
    if (fVerbose != 0) {
      printf("\n");
    }
    ppiVar5[nTotal][nSize] = 0;
  }
  if (nEntries != local_44) {
    __assert_fail("nTotal == nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapUniq.c"
                  ,0x133,"int **Amap_LibLookupTableAlloc(Vec_Ptr_t *, int)");
  }
  return ppiVar5;
}

Assistant:

int ** Amap_LibLookupTableAlloc( Vec_Ptr_t * vVec, int fVerbose )
{
    Vec_Int_t * vOne;
    int ** pRes, * pBuffer;
    int i, k, nTotal, nSize, nEntries, Value;
    // count the total size
    nEntries = nSize = Vec_PtrSize( vVec );
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
        nEntries += Vec_IntSize(vOne);
    pBuffer = ABC_ALLOC( int, nSize * sizeof(void *) + nEntries );
    pRes = (int **)pBuffer;
    pRes[0] = pBuffer + nSize * sizeof(void *);
    nTotal = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
    {
        pRes[i] = pRes[0] + nTotal;
        nTotal += Vec_IntSize(vOne) + 1;
        if ( fVerbose )
        printf( "%d : ", i );
        Vec_IntForEachEntry( vOne, Value, k )
        {
            pRes[i][k] = Value;
            if ( fVerbose )
            printf( "%d(%d) ", Value&0xffff, Value>>16 );
        }
        if ( fVerbose )
        printf( "\n" );
        pRes[i][k] = 0;
    }
    assert( nTotal == nEntries );
    return pRes;
}